

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  long lVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  
  pcVar2 = luaF_getlocalname(p,reg + 1,lastpc);
  *name = pcVar2;
  if (pcVar2 != (char *)0x0) {
    return "local";
  }
  pcVar2 = (char *)p->code;
  uVar3 = ((char)"\b\n\n\t\t\b\b\b\b\b"[*(uint *)((long)pcVar2 + (long)lastpc * 4) & 0x7f] >> 7) +
          lastpc;
  if (uVar3 == 0 ||
      SCARRY4((int)((char)"\b\n\n\t\t\b\b\b\b\b"[*(uint *)((long)pcVar2 + (long)lastpc * 4) & 0x7f]
                   >> 7),lastpc) != (int)uVar3 < 0) {
    iVar5 = -1;
  }
  else {
    uVar7 = 0;
    uVar6 = 0xffffffff;
    iVar8 = 0;
    do {
      uVar4 = *(uint *)((long)pcVar2 + uVar7 * 4);
      uVar13 = uVar4 & 0x7f;
      uVar10 = uVar4 >> 7 & 0xff;
      if (uVar13 < 0x44) {
        if (uVar13 == 8) {
          if ((int)uVar10 <= reg) {
            bVar9 = reg <= (int)(uVar10 + (uVar4 >> 0x10 & 0xff));
            goto LAB_00128587;
          }
        }
        else {
          if (uVar13 != 0x38) goto LAB_0012855d;
          iVar11 = (int)uVar7 + (uVar4 >> 7) + -0xfffffe;
          iVar5 = iVar8;
          if (iVar8 < iVar11) {
            iVar5 = iVar11;
          }
          if (iVar11 <= (int)uVar3) {
            iVar8 = iVar5;
          }
        }
        bVar9 = false;
      }
      else {
        if (1 < uVar13 - 0x44) {
          if (uVar13 != 0x4c) {
LAB_0012855d:
            bVar9 = (bool)(uVar10 == reg & ("\b\n\n\t\t\b\b\b\b\b"[uVar13] & 8) >> 3);
            goto LAB_00128587;
          }
          uVar10 = uVar10 + 2;
        }
        bVar9 = (int)uVar10 <= reg;
      }
LAB_00128587:
      uVar12 = 0xffffffff;
      if ((long)iVar8 <= (long)uVar7) {
        uVar12 = uVar7 & 0xffffffff;
      }
      if (bVar9 != false) {
        uVar6 = uVar12;
      }
      iVar5 = (int)uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  if (iVar5 == -1) goto LAB_001287a5;
  uVar3 = *(uint *)((long)pcVar2 + (long)iVar5 * 4);
  bVar9 = true;
  switch(uVar3 & 0x7f) {
  case 0:
    pcVar2 = (char *)0xff;
    uVar4 = uVar3 >> 0x10 & 0xff;
    bVar9 = (uVar3 >> 7 & 0xff) <= uVar4;
    if (bVar9) goto switchD_001285de_caseD_1;
    pcVar2 = getobjname(p,iVar5,uVar4,name);
    break;
  default:
switchD_001285de_caseD_1:
    break;
  case 3:
    uVar3 = uVar3 >> 0xf;
    goto LAB_00128634;
  case 4:
    uVar3 = *(uint *)((long)pcVar2 + ((long)iVar5 + 1) * 4) >> 7;
LAB_00128634:
    pcVar2 = "constant";
    if (((&p->k->tt_)[uVar3 << 4] & 0xf) == 4) {
      *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar3 << 4)) + 0x18);
      goto LAB_0012879d;
    }
    break;
  case 9:
    lVar1 = *(long *)((long)&p->upvalues->name + (ulong)(uVar3 >> 0xc & 0xff0));
    pcVar2 = "?";
    if (lVar1 != 0) {
      pcVar2 = (char *)(lVar1 + 0x18);
    }
    *name = pcVar2;
    pcVar2 = "upvalue";
    goto LAB_0012879d;
  case 0xb:
    uVar6 = (ulong)(uVar3 >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar6] & 0xf) == 4) {
      pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar6) + 0x18);
    }
    else {
      pcVar2 = "?";
    }
    *name = pcVar2;
    pcVar2 = gxf(p,iVar5,uVar3,1);
    goto LAB_0012879d;
  case 0xc:
    pcVar2 = getobjname(p,iVar5,uVar3 >> 0x18,name);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'c')) {
LAB_001286a1:
      pcVar2 = "?";
      goto LAB_001286a8;
    }
    goto LAB_001286ab;
  case 0xd:
    *name = "integer index";
    pcVar2 = "field";
    goto LAB_0012879d;
  case 0xe:
    uVar6 = (ulong)(uVar3 >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar6] & 0xf) != 4) goto LAB_001286a1;
    pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar6) + 0x18);
LAB_001286a8:
    *name = pcVar2;
LAB_001286ab:
    bVar9 = false;
    pcVar2 = gxf(p,iVar5,uVar3,0);
    break;
  case 0x14:
    if ((short)uVar3 < 0) {
      uVar6 = (ulong)((uVar3 >> 0x18) << 4);
      if (((&p->k->tt_)[uVar6] & 0xf) != 4) goto LAB_0012878c;
      pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar6) + 0x18);
LAB_00128793:
      *name = pcVar2;
    }
    else {
      pcVar2 = getobjname(p,iVar5,uVar3 >> 0x18,name);
      if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'c')) {
LAB_0012878c:
        pcVar2 = "?";
        goto LAB_00128793;
      }
    }
    pcVar2 = "method";
LAB_0012879d:
    bVar9 = false;
  }
  if (bVar9) {
LAB_001287a5:
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, pc, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        rkname(p, pc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}